

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::MergeFrom
          (CustomModel_CustomModelParamValue *this,CustomModel_CustomModelParamValue *from)

{
  bool bVar1;
  uint32_t uVar2;
  int32_t iVar3;
  ulong uVar4;
  LogMessage *other;
  undefined8 *puVar5;
  ulong uVar6;
  ValueUnion VVar7;
  LogFinisher local_61;
  ValueUnion local_60;
  LogMessage local_58;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/CustomModel.pb.cc"
               ,0x181);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_58,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_61,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  uVar2 = from->_oneof_case_[0];
  if ((int)uVar2 < 0x28) {
    if (uVar2 == 10) {
      VVar7 = from->value_;
      if (this->_oneof_case_[0] != 10) {
        local_60 = from->value_;
        clear_value(this);
        this->_oneof_case_[0] = 10;
        VVar7 = local_60;
      }
      this->value_ = VVar7;
      goto LAB_0031f8ca;
    }
    if (uVar2 != 0x14) {
      if (uVar2 == 0x1e) {
        iVar3 = (from->value_).intvalue_;
        if (this->_oneof_case_[0] != 0x1e) {
          clear_value(this);
          this->_oneof_case_[0] = 0x1e;
        }
        (this->value_).intvalue_ = iVar3;
      }
      goto LAB_0031f8ca;
    }
    uVar6 = (from->value_).longvalue_;
    if (this->_oneof_case_[0] != 0x14) {
      clear_value(this);
      this->_oneof_case_[0] = 0x14;
LAB_0031f881:
      (this->value_).doublevalue_ =
           (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
  }
  else {
    if (uVar2 == 0x28) {
      VVar7 = from->value_;
      if (this->_oneof_case_[0] != 0x28) {
        clear_value(this);
        this->_oneof_case_[0] = 0x28;
      }
      this->value_ = VVar7;
      goto LAB_0031f8ca;
    }
    if (uVar2 == 0x32) {
      bVar1 = (from->value_).boolvalue_;
      if (this->_oneof_case_[0] != 0x32) {
        clear_value(this);
        this->_oneof_case_[0] = 0x32;
      }
      (this->value_).boolvalue_ = bVar1;
      goto LAB_0031f8ca;
    }
    if (uVar2 != 0x3c) goto LAB_0031f8ca;
    uVar6 = (from->value_).longvalue_;
    if (this->_oneof_case_[0] != 0x3c) {
      clear_value(this);
      this->_oneof_case_[0] = 0x3c;
      goto LAB_0031f881;
    }
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar5 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
  if ((uVar4 & 1) != 0) {
    puVar5 = (undefined8 *)*puVar5;
  }
  google::protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)&this->value_,uVar6 & 0xfffffffffffffffe,puVar5);
LAB_0031f8ca:
  uVar6 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar6 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void CustomModel_CustomModelParamValue::MergeFrom(const CustomModel_CustomModelParamValue& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CustomModel.CustomModelParamValue)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.value_case()) {
    case kDoubleValue: {
      _internal_set_doublevalue(from._internal_doublevalue());
      break;
    }
    case kStringValue: {
      _internal_set_stringvalue(from._internal_stringvalue());
      break;
    }
    case kIntValue: {
      _internal_set_intvalue(from._internal_intvalue());
      break;
    }
    case kLongValue: {
      _internal_set_longvalue(from._internal_longvalue());
      break;
    }
    case kBoolValue: {
      _internal_set_boolvalue(from._internal_boolvalue());
      break;
    }
    case kBytesValue: {
      _internal_set_bytesvalue(from._internal_bytesvalue());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}